

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

void __thiscall
asio::ssl::context::set_verify_callback<asio::ssl::rfc2818_verification>
          (context *this,rfc2818_verification *callback)

{
  rfc2818_verification local_48;
  undefined1 local_28 [8];
  error_code ec;
  rfc2818_verification *callback_local;
  context *this_local;
  
  ec._M_cat = (error_category *)callback;
  std::error_code::error_code((error_code *)local_28);
  rfc2818_verification::rfc2818_verification(&local_48,callback);
  set_verify_callback<asio::ssl::rfc2818_verification>(this,&local_48,(error_code *)local_28);
  rfc2818_verification::~rfc2818_verification(&local_48);
  asio::detail::throw_error((error_code *)local_28,"set_verify_callback");
  return;
}

Assistant:

void context::set_verify_callback(VerifyCallback callback)
{
  asio::error_code ec;
  this->set_verify_callback(callback, ec);
  asio::detail::throw_error(ec, "set_verify_callback");
}